

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O3

vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
* __thiscall
AddrManImpl::GetEntries_
          (vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
           *__return_storage_ptr__,AddrManImpl *this,bool from_tried)

{
  int (*paiVar1) [64];
  const_iterator cVar2;
  undefined8 uVar3;
  ulong uVar4;
  undefined7 in_register_00000011;
  ulong uVar5;
  int (*paiVar6) [64];
  int (*paiVar7) [64];
  long lVar8;
  long in_FS_OFFSET;
  AddressPosition location;
  int id;
  AddressPosition local_cc;
  int local_bc;
  direct_or_indirect local_b8;
  uint local_a8;
  undefined8 local_a0;
  undefined2 local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  direct_or_indirect local_70;
  uint local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  paiVar6 = this->vvNew;
  uVar4 = 0x400;
  if ((int)CONCAT71(in_register_00000011,from_tried) != 0) {
    uVar4 = 0x100;
  }
  uVar5 = 0;
  do {
    lVar8 = 0;
    paiVar7 = paiVar6;
    do {
      if (from_tried) {
        if (uVar5 < 0x100) {
          paiVar1 = (int (*) [64])(this->vvTried[uVar5] + lVar8);
LAB_0044abb6:
          local_bc = (*paiVar1)[0];
          if (-1 < local_bc) {
            cVar2 = std::
                    _Hashtable<int,_std::pair<const_int,_AddrInfo>,_std::allocator<std::pair<const_int,_AddrInfo>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    ::find(&(this->mapInfo)._M_h,&local_bc);
            if (cVar2.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>._M_cur ==
                (__node_type *)0x0) {
              if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                uVar3 = std::__throw_out_of_range("_Map_base::at");
                if (0x10 < local_a8) {
                  free(local_b8.indirect_contents.indirect);
                }
                std::
                vector<std::pair<AddrInfo,_AddressPosition>,_std::allocator<std::pair<AddrInfo,_AddressPosition>_>_>
                ::~vector(__return_storage_ptr__);
                if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
                  _Unwind_Resume(uVar3);
                }
              }
              goto LAB_0044ad92;
            }
            prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       &local_b8.indirect_contents,
                       (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       ((long)cVar2.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                              ._M_cur + 0x10));
            local_a0 = *(undefined8 *)
                        ((long)cVar2.
                               super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                               _M_cur + 0x28);
            local_98 = *(undefined2 *)
                        ((long)cVar2.
                               super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                               _M_cur + 0x30);
            local_90 = *(undefined8 *)
                        ((long)cVar2.
                               super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                               _M_cur + 0x38);
            uStack_88 = *(undefined8 *)
                         ((long)cVar2.
                                super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                                _M_cur + 0x40);
            local_80 = *(undefined8 *)
                        ((long)cVar2.
                               super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                               _M_cur + 0x48);
            uStack_78 = *(undefined8 *)
                         ((long)cVar2.
                                super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                                _M_cur + 0x50);
            prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
                      ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       &local_70.indirect_contents,
                       (prevector<16U,_unsigned_char,_unsigned_int,_int> *)
                       ((long)cVar2.super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                              ._M_cur + 0x58));
            local_58 = *(undefined8 *)
                        ((long)cVar2.
                               super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                               _M_cur + 0x70);
            local_40 = *(undefined8 *)
                        ((long)cVar2.
                               super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                               _M_cur + 0x88);
            local_50 = *(undefined8 *)
                        ((long)cVar2.
                               super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                               _M_cur + 0x78);
            uStack_48._4_4_ = 1;
            if (!from_tried) {
              uStack_48._4_4_ =
                   (int)((ulong)*(undefined8 *)
                                 ((long)cVar2.
                                        super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>
                                        ._M_cur + 0x80) >> 0x20);
            }
            local_cc.bucket = (int)uVar5;
            local_cc.position = (int)lVar8;
            local_cc.tried = from_tried;
            local_cc.multiplicity = uStack_48._4_4_;
            uStack_48 = *(undefined8 *)
                         ((long)cVar2.
                                super__Node_iterator_base<std::pair<const_int,_AddrInfo>,_false>.
                                _M_cur + 0x80);
            std::
            vector<std::pair<AddrInfo,AddressPosition>,std::allocator<std::pair<AddrInfo,AddressPosition>>>
            ::emplace_back<AddrInfo&,AddressPosition&>
                      ((vector<std::pair<AddrInfo,AddressPosition>,std::allocator<std::pair<AddrInfo,AddressPosition>>>
                        *)__return_storage_ptr__,(AddrInfo *)&local_b8.indirect_contents,&local_cc);
            if (0x10 < local_60) {
              free(local_70.indirect_contents.indirect);
              local_70.indirect_contents.indirect = (char *)0x0;
            }
            if (0x10 < local_a8) {
              free(local_b8.indirect_contents.indirect);
            }
          }
        }
      }
      else {
        paiVar1 = paiVar7;
        if (uVar5 < 0x400) goto LAB_0044abb6;
      }
      lVar8 = lVar8 + 1;
      paiVar7 = (int (*) [64])(*paiVar7 + 1);
    } while (lVar8 != 0x40);
    uVar5 = uVar5 + 1;
    paiVar6 = paiVar6 + 1;
  } while (uVar5 != uVar4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_0044ad92:
  __stack_chk_fail();
}

Assistant:

std::vector<std::pair<AddrInfo, AddressPosition>> AddrManImpl::GetEntries_(bool from_tried) const
{
    AssertLockHeld(cs);

    const int bucket_count = from_tried ? ADDRMAN_TRIED_BUCKET_COUNT : ADDRMAN_NEW_BUCKET_COUNT;
    std::vector<std::pair<AddrInfo, AddressPosition>> infos;
    for (int bucket = 0; bucket < bucket_count; ++bucket) {
        for (int position = 0; position < ADDRMAN_BUCKET_SIZE; ++position) {
            int id = GetEntry(from_tried, bucket, position);
            if (id >= 0) {
                AddrInfo info = mapInfo.at(id);
                AddressPosition location = AddressPosition(
                    from_tried,
                    /*multiplicity_in=*/from_tried ? 1 : info.nRefCount,
                    bucket,
                    position);
                infos.emplace_back(info, location);
            }
        }
    }

    return infos;
}